

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSM::realize(FSM *this)

{
  shared_ptr<kratos::Var> *psVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base_ptr *__return_storage_ptr__;
  size_t sVar2;
  bool bVar3;
  pointer ppFVar4;
  undefined1 auVar5 [8];
  FSM **fsm_1;
  iterator iVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  EnumVar *current_state;
  EnumVar *next_state;
  undefined1 auVar9 [8];
  UserException *pUVar10;
  byte bVar11;
  Generator *pGVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var13;
  size_type *psVar14;
  __type_conflict4 __x;
  double dVar15;
  basic_string_view<char> bVar16;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_1e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  raw_def;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a8;
  undefined1 local_1a0 [8];
  unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state_name_mapping;
  string next_state_name;
  undefined1 local_130 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  undefined1 local_f8 [8];
  _Alloc_hider _Stack_f0;
  undefined1 auStack_e8 [8];
  string current_state_name;
  __node_base_ptr ap_Stack_b8 [2];
  undefined1 local_a8 [8];
  shared_ptr<kratos::IfStmt> seq_if;
  undefined1 auStack_88 [8];
  shared_ptr<kratos::Var> predicate;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined1 auStack_58 [8];
  vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> fsms;
  
  if (this->realized_ != false) {
    return;
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_130,this,false
            );
  if ((long)states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_start - (long)local_130 == 0) {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_e8 = (undefined1  [8])(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    bVar16 = fmt::v7::to_string_view<char,_0>("FSM {0} is empty");
    format_str_00.data_ = (char *)bVar16.size_;
    format_str_00.size_ = 0xd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_e8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a0,(detail *)bVar16.data_,format_str_00,args_00);
    UserException::UserException(pUVar10,(string *)local_1a0);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __x = std::log2<unsigned_long>
                  ((long)states.
                         super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                         ._M_impl.super__Vector_impl_data._M_start - (long)local_130 >> 3);
  dVar15 = ceil(__x);
  seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  if (1 < (uint)(long)dVar15) {
    seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         (uint)(long)dVar15;
  }
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&raw_def;
  raw_def._M_t._M_impl._0_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       raw_def._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_e8 = (undefined1  [8])(this->fsm_name_)._M_dataplus._M_p;
    current_state_name._M_dataplus._M_p = (pointer)(this->fsm_name_)._M_string_length;
    bVar16 = fmt::v7::to_string_view<char,_0>("FSM {0} doesn\'t have a start state");
    format_str_01.data_ = (char *)bVar16.size_;
    format_str_01.size_ = 0xd;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_e8;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_1a0,(detail *)bVar16.data_,format_str_01,args_01);
    UserException::UserException(pUVar10,(string *)local_1a0);
    __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1a0 = (undefined1  [8])&state_name_mapping._M_h._M_rehash_policy._M_next_resize;
  state_name_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  state_name_mapping._M_h._M_bucket_count = 0;
  state_name_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  state_name_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  state_name_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  state_name_mapping._M_h._M_rehash_policy._4_4_ = 0;
  state_name_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  sVar2 = (this->child_fsms_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  p_Var13 = (__node_base_ptr)0x0;
  __return_storage_ptr__ = &state_name_mapping._M_h._M_single_bucket;
  for (auVar9 = local_130;
      auVar9 != (undefined1  [8])
                stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      auVar9 = (undefined1  [8])
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->_M_use_count) {
    current_state_name._M_dataplus._M_p = (pointer)0x0;
    auStack_e8 = (undefined1  [8])&current_state_name._M_string_length;
    current_state_name._M_string_length = current_state_name._M_string_length & 0xffffffffffffff00;
    if (sVar2 == 0) {
      std::__cxx11::string::_M_assign((string *)auStack_e8);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58
                     ,&((key_type)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->
                       _vptr__Sp_counted_base)->parent_->fsm_name_,"_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_58
                     ,&((key_type)
                       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->
                       _vptr__Sp_counted_base)->name_);
      std::__cxx11::string::operator=((string *)auStack_e8,(string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)auStack_58);
    }
    state_name_mapping._M_h._M_single_bucket = p_Var13;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::_M_emplace_unique<std::__cxx11::string&,unsigned_long>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                *)local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8,
               (unsigned_long *)__return_storage_ptr__);
    std::
    _Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<kratos::FSMState*const&,std::__cxx11::string&>
              ((_Hashtable<kratos::FSMState*,std::pair<kratos::FSMState*const,std::__cxx11::string>,std::allocator<std::pair<kratos::FSMState*const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<kratos::FSMState*>,std::hash<kratos::FSMState*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_1a0,auVar9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8);
    FSMState::check_outputs
              ((FSMState *)
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->_vptr__Sp_counted_base);
    std::__cxx11::string::~string((string *)auStack_e8);
    p_Var13 = (__node_base_ptr)((long)&p_Var13->_M_nxt + 1);
  }
  pGVar12 = this->generator_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_e8,
                 &this->fsm_name_,"_state");
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       Generator::enum_(pGVar12,(string *)auStack_e8,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)local_1e0,
                        seq_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_);
  std::__cxx11::string::~string((string *)auStack_e8);
  pGVar12 = this->generator_;
  if (pGVar12->debug == true) {
    auStack_e8 = (undefined1  [8])ap_Stack_b8;
    current_state_name._M_dataplus._M_p = (pointer)0x1;
    current_state_name._M_string_length = 0;
    current_state_name.field_2._M_allocated_capacity = 0;
    current_state_name.field_2._8_4_ = 0x3f800000;
    ap_Stack_b8[0] = (__node_base_ptr)0x0;
    for (auVar9 = local_130;
        auVar9 != (undefined1  [8])
                  states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        auVar9 = (undefined1  [8])
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->_M_use_count) {
      auStack_88 = (undefined1  [8])
                   ((key_type)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar9)->_vptr__Sp_counted_base)
                   ->parent_;
      iVar6 = std::
              _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)auStack_e8,(key_type *)auStack_88);
      if (iVar6.super__Node_iterator_base<const_kratos::FSM_*,_false>._M_cur == (__node_type *)0x0)
      {
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&state_name_mapping._M_h._M_single_bucket,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)((long)auStack_88 + 0xf8))->_M_h)._M_before_begin);
        psVar14 = &next_state_name._M_string_length;
        while (psVar14 = (size_type *)*psVar14, psVar14 != (size_type *)0x0) {
          get_state((FSM *)auStack_58,(string *)auStack_88);
          auVar5 = auStack_58;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
          iVar7 = std::
                  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)local_1a0,(key_type *)auVar9);
          if (iVar7.
              super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              ._M_cur == (__node_type *)0x0) {
            pUVar10 = (UserException *)__cxa_allocate_exception(0x10);
            auStack_58 = *(undefined1 (*) [8])((long)auVar5 + 0x10);
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)((long)auVar5 + 0x18);
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)(this->fsm_name_)._M_dataplus._M_p;
            fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)(this->fsm_name_)._M_string_length;
            bVar16 = fmt::v7::to_string_view<char,_0>
                               (
                               "Unable to find state name {0} from FSM {1}. Is it a disconnected state?"
                               );
            format_str.data_ = (char *)bVar16.size_;
            format_str.size_ = 0xdd;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .field_1.args_ = in_R9.args_;
            args.
            super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
            .desc_ = (unsigned_long_long)auStack_58;
            fmt::v7::detail::vformat_abi_cxx11_
                      ((string *)
                       &states.
                        super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar16.data_,
                       format_str,args);
            UserException::UserException
                      (pUVar10,(string *)
                               &states.
                                super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __cxa_throw(pUVar10,&UserException::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar8 = std::__detail::
                   _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_1a0,(key_type *)auVar9);
          std::__cxx11::string::string((string *)auStack_58,(string *)pmVar8);
          Enum::add_debug_info
                    ((Enum *)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,(string *)auStack_58,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                      *)(psVar14 + 5));
          std::__cxx11::string::~string((string *)auStack_58);
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&state_name_mapping._M_h._M_single_bucket);
      }
    }
    std::
    _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)auStack_e8);
    pGVar12 = this->generator_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&state_name_mapping._M_h._M_single_bucket,"current_state",
             (allocator<char> *)auStack_58);
  Generator::get_unique_variable_name
            ((string *)auStack_e8,pGVar12,&this->fsm_name_,
             (string *)&state_name_mapping._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&state_name_mapping._M_h._M_single_bucket);
  pGVar12 = this->generator_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_58,"next_state",
             (allocator<char> *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  Generator::get_unique_variable_name
            ((string *)&state_name_mapping._M_h._M_single_bucket,pGVar12,&this->fsm_name_,
             (string *)auStack_58);
  std::__cxx11::string::~string((string *)auStack_58);
  pGVar12 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  current_state =
       Generator::enum_var(pGVar12,(string *)auStack_e8,(shared_ptr<kratos::Enum> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
  this->current_state_ = current_state;
  pGVar12 = this->generator_;
  std::__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Enum,void>
            ((__shared_ptr<kratos::Enum,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
             (__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
             stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  next_state = Generator::enum_var(pGVar12,(string *)&state_name_mapping._M_h._M_single_bucket,
                                   (shared_ptr<kratos::Enum> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
  if (this->generator_->debug == true) {
    auStack_58 = (undefined1  [8])0x21f697;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x95);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(current_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)auStack_58);
    auStack_58 = (undefined1  [8])0x21f697;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0x96);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(next_state->super_Var).super_IRNode.fn_name_ln,
               (pair<const_char_*,_int> *)auStack_58);
  }
  Generator::sequential
            ((Generator *)
             &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ppFVar4 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  auStack_58 = (undefined1  [8])((ulong)auStack_58 & 0xffffffff00000000);
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&fsms,
             &(this->clk_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)ppFVar4,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  psVar1 = &this->reset_;
  if (((this->reset_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_ ==
      PortIO) {
    Var::as<kratos::Port>((Var *)auStack_58);
    if ((*(byte *)((long)auStack_58 + 0x279) & 1) == 0) {
      bVar11 = this->reset_high_;
    }
    else {
      Var::as<kratos::Port>((Var *)auStack_88);
      bVar11 = this->reset_high_ &
               *(byte *)&(((element_type *)((long)auStack_88 + 0x270))->super_IRNode).fn_name_ln.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
    ppFVar4 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((bVar11 & 1) == 0) {
      auStack_58._0_4_ = 1;
      std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&fsms,
                 &psVar1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
      SequentialStmtBlock::add_condition
                ((SequentialStmtBlock *)ppFVar4,
                 (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      bVar3 = true;
      goto LAB_001b1228;
    }
  }
  ppFVar4 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  auStack_58 = (undefined1  [8])((ulong)auStack_58 & 0xffffffff00000000);
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&fsms,
             &psVar1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)ppFVar4,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  bVar3 = false;
LAB_001b1228:
  if (this->generator_->debug == true) {
    auStack_58 = (undefined1  [8])0x21f697;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xab);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)(states.
                   super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 1),
               (pair<const_char_*,_int> *)auStack_58);
  }
  auStack_88 = (undefined1  [8])0x0;
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if (bVar3) {
    Var::r_not((psVar1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    Var::as<kratos::Var>((Var *)auStack_58);
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
               (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
  }
  else {
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)auStack_88,
               &psVar1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::make_shared<kratos::IfStmt,std::shared_ptr<kratos::Var>&>
            ((shared_ptr<kratos::Var> *)local_a8);
  predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pmVar8 = std::__detail::
           _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)local_1a0,
                (key_type *)
                &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string((string *)auStack_58,(string *)pmVar8);
  Enum::get_enum((Enum *)&raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (string *)
                 stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
  local_f8 = (undefined1  [8])raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count;
  _Stack_f0._M_p = (pointer)_Stack_1a8._M_pi;
  raw_def._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Var::assign((Var *)&predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(shared_ptr<kratos::Var> *)current_state,(AssignmentType)local_f8)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1a8);
  auVar9 = local_a8;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::AssignStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)local_f8,
             (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
             &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  IfStmt::add_then_stmt((IfStmt *)auVar9,(shared_ptr<kratos::Stmt> *)local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_f0);
  if (this->generator_->debug == true) {
    if ((this->start_state_debug_).first._M_string_length != 0) {
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)&(predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count,&this->start_state_debug_);
    }
    local_f8 = (undefined1  [8])0x21f697;
    _Stack_f0._M_p._0_4_ = 0xbf;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count,(pair<const_char_*,_int> *)local_f8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  std::__cxx11::string::~string((string *)auStack_58);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(next_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  Var::assign((Var *)auStack_58,(shared_ptr<kratos::Var> *)current_state,(int)&predicate + 8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  if (this->generator_->debug == true) {
    predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_392bdd;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0xc5;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((long)auStack_58 + 8),
               (pair<const_char_*,_int> *)
               &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  auVar9 = local_a8;
  this_00 = &predicate.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::AssignStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
  IfStmt::add_else_stmt((IfStmt *)auVar9,(shared_ptr<kratos::Stmt> *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_a8);
  StmtBlock::add_stmt((StmtBlock *)
                      states.
                      super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (shared_ptr<kratos::Stmt> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&fsms);
  if (this->generator_->debug == true) {
    auStack_58 = (undefined1  [8])0x21f697;
    fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,0xca);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(((Stmt *)local_a8)->super_IRNode).fn_name_ln,
               (pair<const_char_*,_int> *)auStack_58);
  }
  generate_state_transition
            (this,(Enum *)stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,current_state,next_state,
             (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1a0);
  if (this->moore_ == true) {
    generate_output(this,(Enum *)stmt.
                                 super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,current_state,
                    (unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a0);
  }
  get_all_child_fsm((vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)auStack_58,this);
  for (auVar9 = auStack_58;
      auVar9 != (undefined1  [8])
                fsms.super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>._M_impl.
                super__Vector_impl_data._M_start; auVar9 = (undefined1  [8])((long)auVar9 + 8)) {
    (*(FSM **)auVar9)->realized_ = true;
  }
  this->realized_ = true;
  std::_Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::~_Vector_base
            ((_Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq_if);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&predicate);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&seq);
  std::__cxx11::string::~string((string *)&state_name_mapping._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)auStack_e8);
  std::
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_1e0);
  std::_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Vector_base
            ((_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_130);
  return;
}

Assistant:

void FSM::realize() {
    // never realize again
    if (realized_) return;
    // generate the statements to the generator
    // first, get state and next state variable
    // compute number of states
    auto states = get_all_child_states(false);
    uint64_t num_states = states.size();
    if (!num_states) throw UserException(::format("FSM {0} is empty", fsm_name()));
    uint32_t width = std::max<uint32_t>(1u, std::ceil(std::log2(num_states)));
    // define a enum type
    std::map<std::string, uint64_t> raw_def;
    uint64_t count = 0;
    if (!start_state_)
        throw UserException(::format("FSM {0} doesn't have a start state", fsm_name_));
    // name mapping
    std::unordered_map<FSMState*, std::string> state_name_mapping;
    bool has_child_state = !child_fsms_.empty();
    for (auto const& state : states) {
        // notice that we need to do an additional mapping if it's a nested fsm
        // to avoid any name conflicts
        std::string state_name;
        if (has_child_state) {
            state_name = state->parent()->fsm_name() + "_" + state->name();
        } else {
            state_name = state->name();
        }
        raw_def.emplace(state_name, count++);
        state_name_mapping.emplace(state, state_name);
        // check states
        state->check_outputs();
    }
    auto& enum_def = generator_->enum_(fsm_name_ + "_state", raw_def, width);
    // add debug info
    if (generator_->debug) {
        std::unordered_set<const FSM*> visited;
        for (auto const& state : states) {
            const auto* fsm = state->parent();
            if (visited.find(fsm) != visited.end()) continue;
            auto fn_ln = fsm->fn_name_ln_;
            for (auto const& [name, info] : fn_ln) {
                auto* s = fsm->get_state(name).get();
                if (state_name_mapping.find(state) == state_name_mapping.end()) {
                    throw UserException(::format(
                        "Unable to find state name {0} from FSM {1}. Is it a disconnected state?",
                        s->name(), fsm_name_));
                }
                auto state_name = state_name_mapping.at(state);
                enum_def.add_debug_info(state_name, info);
            }
        }
    }
    // create two state variable, current_state, and next_state
    auto current_state_name = generator_->get_unique_variable_name(fsm_name_, "current_state");
    auto next_state_name = generator_->get_unique_variable_name(fsm_name_, "next_state");
    auto& current_state = generator_->enum_var(current_state_name, enum_def.shared_from_this());
    current_state_ = &current_state;
    auto& next_state = generator_->enum_var(next_state_name, enum_def.shared_from_this());
    if (generator_->debug) {
        current_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        next_state.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    // sequential logic
    // if (reset)
    //   current_state <= default_state
    // else
    //   current_state <= next_state
    auto seq = generator_->sequential();
    bool reset_high = true;
    seq->add_condition({EventEdgeType::Posedge, clk_});
    if (reset_->type() == VarType::PortIO &&
        ((reset_->as<Port>()->active_high() && !(*reset_->as<Port>()->active_high())) ||
         !reset_high_)) {
        seq->add_condition({EventEdgeType::Negedge, reset_});
        reset_high = false;
    } else {
        seq->add_condition({EventEdgeType::Posedge, reset_});
        reset_high = true;
    }
    if (generator_->debug) {
        seq->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }

    std::shared_ptr<Var> predicate;
    if (reset_high) {
        predicate = reset_;
    } else {
        predicate = (reset_->r_not()).as<Var>();
    }

    auto seq_if = std::make_shared<IfStmt>(predicate);
    {
        auto start_state_name = state_name_mapping.at(start_state_.get());
        auto stmt =
            current_state.assign(enum_def.get_enum(start_state_name), AssignmentType::NonBlocking);
        seq_if->add_then_stmt(stmt);
        if (generator_->debug) {
            if (!start_state_debug_.first.empty()) {
                stmt->fn_name_ln.emplace_back(start_state_debug_);
            }
            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }
    }
    {
        auto stmt =
            current_state.assign(next_state.shared_from_this(), AssignmentType::NonBlocking);
        if (generator_->debug) stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        seq_if->add_else_stmt(stmt);
    }
    // add it to the seq
    seq->add_stmt(seq_if);
    if (generator_->debug) seq_if->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));

    // combination logic to compute next state
    generate_state_transition(enum_def, current_state, next_state, state_name_mapping);

    // now the output logic
    // only generate output state block in moore machine. in mealy machine, the output
    // is fused inside the state transition.
    if (moore_) generate_output(enum_def, current_state, state_name_mapping);

    // set to realized for all states
    auto fsms = get_all_child_fsm();
    for (auto& fsm : fsms) fsm->realized_ = true;
    realized_ = true;
}